

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

cgltf_result cgltf_parse(cgltf_options *options,void *data,cgltf_size size,cgltf_data **out_data)

{
  cgltf_data *pcVar1;
  _func_void_ptr_void_ptr_cgltf_size *p_Var2;
  _func_void_void_ptr_void_ptr *p_Var3;
  cgltf_result cVar4;
  ulong size_00;
  uint8_t *json_chunk;
  cgltf_size cVar5;
  uint8_t *puVar6;
  uint uVar7;
  uint uVar8;
  cgltf_options fixed_options;
  cgltf_options local_58;
  
  if (size < 0xc) {
    return cgltf_result_data_too_short;
  }
  if (options == (cgltf_options *)0x0) {
    return cgltf_result_invalid_options;
  }
  local_58.type = options->type;
  local_58._4_4_ = *(undefined4 *)&options->field_0x4;
  local_58.json_token_count = options->json_token_count;
  p_Var2 = (options->memory).alloc;
  p_Var3 = (options->memory).free;
  local_58.memory.user_data = (options->memory).user_data;
  local_58.file.read = (options->file).read;
  local_58.file.release = (options->file).release;
  local_58.file.user_data = (options->file).user_data;
  local_58.memory.alloc._0_4_ = (uint)p_Var2;
  local_58.memory.alloc._4_4_ = (uint)((ulong)p_Var2 >> 0x20);
  local_58.memory.free._0_4_ = (uint)p_Var3;
  local_58.memory.free._4_4_ = (uint)((ulong)p_Var3 >> 0x20);
  uVar7 = -(uint)(local_58.memory.alloc._4_4_ == 0) & -(uint)((uint)local_58.memory.alloc == 0);
  uVar8 = -(uint)(local_58.memory.free._4_4_ == 0) & -(uint)((uint)local_58.memory.free == 0);
  local_58.memory.alloc =
       (_func_void_ptr_void_ptr_cgltf_size *)
       CONCAT44(~(-(uint)((uint)local_58.memory.alloc == 0) &
                 -(uint)(local_58.memory.alloc._4_4_ == 0)) & local_58.memory.alloc._4_4_,
                ~uVar7 & (uint)local_58.memory.alloc | uVar7 & 0x133d20);
  local_58.memory.free =
       (_func_void_void_ptr_void_ptr *)
       CONCAT44(~(-(uint)((uint)local_58.memory.free == 0) &
                 -(uint)(local_58.memory.free._4_4_ == 0)) & local_58.memory.free._4_4_,
                ~uVar8 & (uint)local_58.memory.free | uVar8 & 0x133d9c);
  if (*data == 0x46546c67) {
    if (local_58.type != cgltf_file_type_gltf) {
LAB_00133c74:
      if (*(uint *)((long)data + 4) != 2) {
        if (*(uint *)((long)data + 4) < 2) {
          return cgltf_result_legacy_gltf;
        }
        return cgltf_result_unknown_format;
      }
      if (size < 0x14) {
        return cgltf_result_data_too_short;
      }
      if (size < *(uint *)((long)data + 8)) {
        return cgltf_result_data_too_short;
      }
      size_00 = (ulong)*(uint *)((long)data + 0xc);
      if (size_00 + 0x14 <= size) {
        if (*(int *)((long)data + 0x10) != 0x4e4f534a) {
          return cgltf_result_unknown_format;
        }
        json_chunk = (uint8_t *)((long)data + 0x14);
        puVar6 = (uint8_t *)0x0;
        cVar5 = 0;
        if (size_00 + 0x1c <= size) {
          cVar5 = (cgltf_size)*(uint *)(json_chunk + size_00);
          if (size < size_00 + 0x1c + cVar5) {
            return cgltf_result_data_too_short;
          }
          if (*(int *)(json_chunk + size_00 + 4) != 0x4e4942) {
            return cgltf_result_unknown_format;
          }
          puVar6 = json_chunk + size_00 + 8;
        }
        cVar4 = cgltf_parse_json(&local_58,json_chunk,size_00,out_data);
        if (cVar4 == cgltf_result_success) {
          pcVar1 = *out_data;
          pcVar1->file_type = cgltf_file_type_glb;
          pcVar1->bin = puVar6;
          (*out_data)->bin_size = cVar5;
          return cgltf_result_success;
        }
        return cVar4;
      }
      return cgltf_result_data_too_short;
    }
  }
  else {
    if (local_58.type == cgltf_file_type_glb) {
      return cgltf_result_unknown_format;
    }
    if (local_58.type != cgltf_file_type_gltf) {
      if (local_58.type != cgltf_file_type_invalid) goto LAB_00133c74;
      local_58.type = cgltf_file_type_gltf;
    }
  }
  cVar4 = cgltf_parse_json(&local_58,(uint8_t *)data,size,out_data);
  if (cVar4 == cgltf_result_success) {
    (*out_data)->file_type = cgltf_file_type_gltf;
    return cgltf_result_success;
  }
  return cVar4;
}

Assistant:

cgltf_result cgltf_parse(const cgltf_options* options, const void* data, cgltf_size size, cgltf_data** out_data)
{
    if (size < GlbHeaderSize)
    {
        return cgltf_result_data_too_short;
    }

    if (options == NULL)
    {
        return cgltf_result_invalid_options;
    }

    cgltf_options fixed_options = *options;
    if (fixed_options.memory.alloc == NULL)
    {
        fixed_options.memory.alloc = &cgltf_default_alloc;
    }
    if (fixed_options.memory.free == NULL)
    {
        fixed_options.memory.free = &cgltf_default_free;
    }

    uint32_t tmp;
    // Magic
    memcpy(&tmp, data, 4);
    if (tmp != GlbMagic)
    {
        if (fixed_options.type == cgltf_file_type_invalid)
        {
            fixed_options.type = cgltf_file_type_gltf;
        }
        else if (fixed_options.type == cgltf_file_type_glb)
        {
            return cgltf_result_unknown_format;
        }
    }

    if (fixed_options.type == cgltf_file_type_gltf)
    {
        cgltf_result json_result = cgltf_parse_json(&fixed_options, (const uint8_t*)data, size, out_data);
        if (json_result != cgltf_result_success)
        {
            return json_result;
        }

        (*out_data)->file_type = cgltf_file_type_gltf;

        return cgltf_result_success;
    }

    const uint8_t* ptr = (const uint8_t*)data;
    // Version
    memcpy(&tmp, ptr + 4, 4);
    uint32_t version = tmp;
    if (version != GlbVersion)
    {
        return version < GlbVersion ? cgltf_result_legacy_gltf : cgltf_result_unknown_format;
    }

    // Total length
    memcpy(&tmp, ptr + 8, 4);
    if (tmp > size)
    {
        return cgltf_result_data_too_short;
    }

    const uint8_t* json_chunk = ptr + GlbHeaderSize;

    if (GlbHeaderSize + GlbChunkHeaderSize > size)
    {
        return cgltf_result_data_too_short;
    }

    // JSON chunk: length
    uint32_t json_length;
    memcpy(&json_length, json_chunk, 4);
    if (GlbHeaderSize + GlbChunkHeaderSize + json_length > size)
    {
        return cgltf_result_data_too_short;
    }

    // JSON chunk: magic
    memcpy(&tmp, json_chunk + 4, 4);
    if (tmp != GlbMagicJsonChunk)
    {
        return cgltf_result_unknown_format;
    }

    json_chunk += GlbChunkHeaderSize;

    const void* bin = 0;
    cgltf_size bin_size = 0;

    if (GlbHeaderSize + GlbChunkHeaderSize + json_length + GlbChunkHeaderSize <= size)
    {
        // We can read another chunk
        const uint8_t* bin_chunk = json_chunk + json_length;

        // Bin chunk: length
        uint32_t bin_length;
        memcpy(&bin_length, bin_chunk, 4);
        if (GlbHeaderSize + GlbChunkHeaderSize + json_length + GlbChunkHeaderSize + bin_length > size)
        {
            return cgltf_result_data_too_short;
        }

        // Bin chunk: magic
        memcpy(&tmp, bin_chunk + 4, 4);
        if (tmp != GlbMagicBinChunk)
        {
            return cgltf_result_unknown_format;
        }

        bin_chunk += GlbChunkHeaderSize;

        bin = bin_chunk;
        bin_size = bin_length;
    }

    cgltf_result json_result = cgltf_parse_json(&fixed_options, json_chunk, json_length, out_data);
    if (json_result != cgltf_result_success)
    {
        return json_result;
    }

    (*out_data)->file_type = cgltf_file_type_glb;
    (*out_data)->bin = bin;
    (*out_data)->bin_size = bin_size;

    return cgltf_result_success;
}